

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::setup_shuffleColumn(HModel *this)

{
  pointer piVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer pdVar8;
  int i;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int i_1;
  bool bVar17;
  vector<int,_std::allocator<int>_> iFrom;
  HRandom localRandom;
  vector<int,_std::allocator<int>_> start;
  vector<double,_std::allocator<double>_> du_ColUpperImplied;
  vector<double,_std::allocator<double>_> pr_ColUpperImplied;
  vector<double,_std::allocator<double>_> pr_ColLowerImplied;
  vector<double,_std::allocator<double>_> dxpert;
  vector<int,_std::allocator<int>_> ibreak;
  vector<double,_std::allocator<double>_> xcost;
  vector<double,_std::allocator<double>_> upper;
  vector<double,_std::allocator<double>_> lower;
  vector<double,_std::allocator<double>_> value;
  vector<int,_std::allocator<int>_> index;
  vector<double,_std::allocator<double>_> du_ColLowerImplied;
  
  if (this->intOption[4] != 0) {
    localRandom.random_mw = 0x7c1;
    localRandom.random_mz = 0x7dc;
    iVar14 = 10;
    while (bVar17 = iVar14 != 0, iVar14 = iVar14 + -1, bVar17) {
      HRandom::intRandom(&localRandom);
    }
    std::vector<int,_std::allocator<int>_>::vector
              (&iFrom,(long)this->numCol,(allocator_type *)&start);
    for (lVar10 = 0; lVar10 < this->numCol; lVar10 = lVar10 + 1) {
      iFrom.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar10] = (int)lVar10;
    }
    for (uVar12 = (ulong)(uint)this->numCol; 1 < (int)uVar12; uVar12 = uVar12 - 1) {
      iVar9 = HRandom::intRandom(&localRandom);
      iVar9 = iVar9 % (int)uVar12;
      iVar14 = iFrom.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar12 - 1];
      iFrom.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar12 - 1] = iFrom.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar9];
      iFrom.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [iVar9] = iVar14;
    }
    std::vector<int,_std::allocator<int>_>::vector(&start,&this->Astart);
    std::vector<int,_std::allocator<int>_>::vector(&index,&this->Aindex);
    std::vector<double,_std::allocator<double>_>::vector(&value,&this->Avalue);
    std::vector<double,_std::allocator<double>_>::vector(&lower,&this->colLower);
    std::vector<double,_std::allocator<double>_>::vector(&upper,&this->colUpper);
    std::vector<double,_std::allocator<double>_>::vector(&xcost,&this->colCost);
    std::vector<int,_std::allocator<int>_>::vector(&ibreak,&this->intBreak);
    std::vector<double,_std::allocator<double>_>::vector(&dxpert,&this->dblXpert);
    piVar1 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->intBreak).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->dblXpert).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar14 = 0;
    for (lVar10 = 0; lVar10 < this->numCol; lVar10 = lVar10 + 1) {
      lVar11 = (long)iFrom.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10];
      piVar1[lVar10] = iVar14;
      lVar13 = (long)start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11];
      piVar7 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar15 = 0;
          lVar13 + lVar15 <
          (long)start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar11 + 1]; lVar15 = lVar15 + 1) {
        piVar7[iVar14 + lVar15] =
             index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar13 + lVar15];
        pdVar8[iVar14 + lVar15] =
             value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar13 + lVar15];
      }
      iVar14 = iVar14 + (int)lVar15;
      pdVar2[lVar10] =
           lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start[lVar11];
      pdVar3[lVar10] =
           upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start[lVar11];
      pdVar4[lVar10] =
           xcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start[lVar11];
      piVar5[lVar10] =
           ibreak.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar11];
      pdVar6[lVar10] =
           dxpert.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar11];
    }
    if (this->impliedBoundsPresolve != false) {
      std::vector<double,_std::allocator<double>_>::vector
                (&pr_ColLowerImplied,&this->primalColLowerImplied);
      std::vector<double,_std::allocator<double>_>::vector
                (&pr_ColUpperImplied,&this->primalColUpperImplied);
      std::vector<double,_std::allocator<double>_>::vector
                (&du_ColUpperImplied,&this->dualColUpperImplied);
      std::vector<double,_std::allocator<double>_>::vector
                (&du_ColLowerImplied,&this->dualColLowerImplied);
      pdVar2 = (this->primalColLowerImplied).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar3 = (this->primalColUpperImplied).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (this->dualColUpperImplied).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (this->dualColLowerImplied).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar16 = 0;
      uVar12 = (ulong)(uint)this->numCol;
      if (this->numCol < 1) {
        uVar12 = uVar16;
      }
      for (; uVar12 != uVar16; uVar16 = uVar16 + 1) {
        iVar14 = iFrom.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar16];
        pdVar2[uVar16] =
             pr_ColLowerImplied.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar14];
        pdVar3[uVar16] =
             pr_ColUpperImplied.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar14];
        pdVar4[uVar16] =
             du_ColUpperImplied.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar14];
        pdVar6[uVar16] =
             du_ColLowerImplied.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar14];
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&du_ColLowerImplied.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&du_ColUpperImplied.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&pr_ColUpperImplied.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&pr_ColLowerImplied.super__Vector_base<double,_std::allocator<double>_>);
    }
    mlFg_Update(this,this->mlFg_action_ShuffleLP);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&dxpert.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&ibreak.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&xcost.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&upper.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&lower.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&value.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&index.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&start.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&iFrom.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void HModel::setup_shuffleColumn() {
    if (intOption[INTOPT_PERMUTE_FLAG] == 0)
        return;

    // 1. Shuffle the column index
    HRandom localRandom;
    for (int i = 0; i < 10; i++)
        localRandom.intRandom();
    vector<int> iFrom(numCol);
    for (int i = 0; i < numCol; i++)
        iFrom[i] = i;
    for (int i = numCol - 1; i >= 1; i--) {
        int j = localRandom.intRandom() % (i + 1);
        swap(iFrom[i], iFrom[j]);
    }

    // 2. Save original copy
    vector<int> start = Astart;
    vector<int> index = Aindex;
    vector<double> value = Avalue;
    vector<double> lower = colLower;
    vector<double> upper = colUpper;
    vector<double> xcost = colCost;
    vector<int> ibreak = intBreak;
    vector<double> dxpert = dblXpert;

    // 3. Generate the permuted matrix
    int countX = 0;
    for (int i = 0; i < numCol; i++) {
        int ifrom = iFrom[i];
        Astart[i] = countX;
        for (int k = start[ifrom]; k < start[ifrom + 1]; k++) {
            Aindex[countX] = index[k];
            Avalue[countX] = value[k];
            countX++;
        }
        colLower[i] = lower[ifrom];
        colUpper[i] = upper[ifrom];
        colCost[i] = xcost[ifrom];
        intBreak[i] = ibreak[ifrom];
        dblXpert[i] = dxpert[ifrom];
    }
	if (impliedBoundsPresolve) {
		vector<double> pr_ColLowerImplied = primalColLowerImplied;
		vector<double> pr_ColUpperImplied = primalColUpperImplied;
		vector<double> du_ColUpperImplied = dualColUpperImplied;
		vector<double> du_ColLowerImplied = dualColLowerImplied;
		for (int i = 0; i < numCol; i++) {
			int ifrom = iFrom[i];
			primalColLowerImplied[i] = pr_ColLowerImplied[ifrom];
			primalColUpperImplied[i] = pr_ColUpperImplied[ifrom];
			dualColUpperImplied[i] = du_ColUpperImplied[ifrom];
			dualColLowerImplied[i] = du_ColLowerImplied[ifrom];
		}
	}
    assert(Astart[numCol] == countX);
    //Deduce the consequences of shuffling the LP
    mlFg_Update(mlFg_action_ShuffleLP);
}